

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroIO.cpp
# Opt level: O1

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>_>
* __thiscall
OpenMD::HydroIO::parseHydroFile
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>_>
           *__return_storage_ptr__,HydroIO *this,string *f)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ParseErrorCode PVar3;
  double dVar4;
  basic_istream<char,_std::char_traits<char>_> *pbVar5;
  int iVar6;
  MemberIterator pGVar7;
  Type pGVar8;
  HydroProp *this_00;
  Type pGVar9;
  ulong uVar10;
  double *pdVar11;
  long lVar12;
  uint i;
  char *pcVar13;
  BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *__s;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *this_01;
  long lVar14;
  BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *pBVar15;
  string name;
  Vector3d cor;
  IStreamWrapper isw;
  ifstream ifs;
  undefined1 *local_500;
  char *local_4f8;
  undefined1 local_4f0;
  undefined7 uStack_4ef;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *local_4e0;
  long *local_4d8 [2];
  long local_4c8 [2];
  double local_4b8 [3];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>
  local_4a0;
  BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> local_478 [4];
  basic_istream<char,_std::char_traits<char>_> local_358;
  Mat6x6d local_150;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::ifstream::ifstream(&local_358,(string *)f,_S_in);
  if (*(int *)((long)&local_358 +
              *(long *)((long)local_358._vptr_basic_istream + 0xffffffffffffffe8) + 0x20) != 0) {
    snprintf(painCave.errMsg,2000,"HydroIO: Cannot open file: %s\n",(f->_M_dataplus)._M_p);
    painCave.isFatal = 1;
    simError();
  }
  iVar6 = std::istream::peek();
  if (iVar6 != -1) {
    local_478[0].buffer_ = local_478[0].peekBuffer_;
    local_478[0].bufferSize_ = 4;
    local_478[0].bufferLast_ = (Ch *)0x0;
    local_478[0].readCount_ = 0;
    local_478[0].count_ = 0;
    local_478[0].eof_ = false;
    local_478[0].stream_ = &local_358;
    local_478[0].current_ = local_478[0].buffer_;
    rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read
              (local_478);
    rapidjson::
    GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
    ::ParseStream<0u,rapidjson::UTF8<char>,rapidjson::BasicIStreamWrapper<std::istream>>
              ((GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
                *)&this->d_,local_478);
    PVar3 = (this->d_).parseResult_.code_;
    if ((long)(int)PVar3 != 0) {
      if (PVar3 < (kParseErrorTermination|kParseErrorDocumentRootNotSingular)) {
        pcVar13 = &DAT_002a4368 +
                  *(int *)(rapidjson::internal::Pow10(int)::e + (long)(int)PVar3 * 4 + 0x9a4);
      }
      else {
        pcVar13 = "Unknown error.";
      }
      snprintf(painCave.errMsg,2000,"HydroIO: JSON parse error in file %s\n\tError: %zu : %s\n",
               (f->_M_dataplus)._M_p,(this->d_).parseResult_.offset_,pcVar13);
      painCave.isFatal = 1;
      simError();
    }
    if ((this->d_).
        super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        .data_.f.flags != 3) {
      builtin_strncpy(painCave.errMsg,"HydroIO: OpenMD-Hydro should be a single object.\n",0x32);
      painCave.isFatal = 1;
      simError();
    }
    pGVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::FindMember(&(this->d_).
                           super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          ,"OpenMD-Hydro");
    if (pGVar7 == (MemberIterator)
                  ((ulong)(this->d_).
                          super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          .data_.s.length * 0x20 +
                  ((ulong)(this->d_).
                          super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          .data_.s.str & 0xffffffffffff))) {
      snprintf(painCave.errMsg,2000,"HydroIO: File %s does not have a OpenMD-Hydro object.\n",
               (f->_M_dataplus)._M_p);
      painCave.isFatal = 1;
      simError();
    }
  }
  pGVar8 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)&this->d_,"OpenMD-Hydro");
  uVar10 = (ulong)(pGVar8->data_).s.length;
  if (uVar10 != 0) {
    this_01 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               *)((ulong)(pGVar8->data_).s.str & 0xffffffffffff);
    local_4e0 = this_01 + uVar10 * 0x10;
    do {
      __s = local_478;
      this_00 = (HydroProp *)operator_new(0x280);
      HydroProp::HydroProp(this_00);
      local_500 = &local_4f0;
      local_4f8 = (char *)0x0;
      local_4f0 = 0;
      local_4b8[0] = 0.0;
      local_4b8[1] = 0.0;
      local_4b8[2] = 0.0;
      memset(__s,0,0x120);
      pGVar9 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>(this_01,"name");
      pcVar13 = local_4f8;
      pGVar8 = (Type)((ulong)(pGVar9->data_).s.str & 0xffffffffffff);
      if (((pGVar9->data_).f.flags >> 0xc & 1) != 0) {
        pGVar8 = pGVar9;
      }
      strlen((char *)pGVar8);
      std::__cxx11::string::_M_replace((ulong)&local_500,0,pcVar13,(ulong)pGVar8);
      pdVar11 = local_4b8;
      lVar14 = 0;
      do {
        pGVar8 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>(this_01,"centerOfResistance");
        dVar4 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::GetDouble((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)(((ulong)(pGVar8->data_).s.str & 0xffffffffffff) + lVar14));
        *pdVar11 = dVar4;
        lVar14 = lVar14 + 0x10;
        pdVar11 = pdVar11 + 1;
      } while (lVar14 != 0x30);
      lVar14 = 0;
      do {
        lVar12 = 0;
        pBVar15 = __s;
        do {
          pGVar8 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>(this_01,"resistanceTensor");
          pbVar5 = (basic_istream<char,_std::char_traits<char>_> *)
                   rapidjson::
                   GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::GetDouble((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                *)((*(ulong *)(((ulong)(pGVar8->data_).s.str & 0xffffffffffff) + 8 +
                                              lVar14 * 0x10) & 0xffffffffffff) + lVar12));
          pBVar15->stream_ = pbVar5;
          lVar12 = lVar12 + 0x10;
          pBVar15 = (BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *)
                    pBVar15->peekBuffer_;
        } while (lVar12 != 0x60);
        lVar14 = lVar14 + 1;
        __s = (BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *)
              &__s->readCount_;
      } while (lVar14 != 6);
      local_4d8[0] = local_4c8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_4d8,local_500,local_4f8 + (long)local_500);
      paVar2 = &local_4a0.first.field_2;
      std::__cxx11::string::_M_assign((string *)this_00);
      if (local_4d8[0] != local_4c8) {
        operator_delete(local_4d8[0],local_4c8[0] + 1);
      }
      (this_00->cor_).super_Vector<double,_3U>.data_[2] = local_4b8[2];
      (this_00->cor_).super_Vector<double,_3U>.data_[0] = local_4b8[0];
      (this_00->cor_).super_Vector<double,_3U>.data_[1] = local_4b8[1];
      this_00->hasCOR_ = true;
      memcpy(&local_150,local_478,0x120);
      HydroProp::setResistanceTensor(this_00,&local_150);
      local_4a0.first._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4a0,local_500,local_4f8 + (long)local_500);
      local_4a0.second = this_00;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::HydroProp*>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::HydroProp*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::HydroProp*>>>
      ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::HydroProp*>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::HydroProp*>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::HydroProp*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::HydroProp*>>>
                  *)__return_storage_ptr__,&local_4a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a0.first._M_dataplus._M_p != paVar2) {
        operator_delete(local_4a0.first._M_dataplus._M_p,
                        local_4a0.first.field_2._M_allocated_capacity + 1);
      }
      if (local_500 != &local_4f0) {
        operator_delete(local_500,CONCAT71(uStack_4ef,local_4f0) + 1);
      }
      this_01 = this_01 + 0x10;
    } while (this_01 != local_4e0);
  }
  std::ifstream::~ifstream(&local_358);
  return __return_storage_ptr__;
}

Assistant:

map<string, HydroProp*> HydroIO::parseHydroFile(const string& f) {
    map<string, HydroProp*> props;

    ifstream ifs(f);

    if (!ifs.good()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "HydroIO: Cannot open file: %s\n", f.c_str());
      painCave.isFatal = 1;
      simError();
    }

#if defined(NLOHMANN_JSON)
    json ij = json::parse(ifs);

    auto& entries = ij["OpenMD-Hydro"];

    for (auto& entry : entries) {
      HydroProp* hp = new HydroProp();
      std::string name;
      Vector3d cor;
      Mat6x6d Xi;

      name = entry["name"].get<std::string>();

      for (unsigned int i = 0; i < 3; i++) {
        cor[i] = entry["centerOfResistance"].get<vector<RealType>>()[i];
      }

      for (unsigned int i = 0; i < 6; i++) {
        for (unsigned int j = 0; j < 6; j++) {
          Xi(i, j) =
              entry["resistanceTensor"].get<vector<vector<RealType>>>()[i][j];
        }
      }

      hp->setName(name);
      hp->setCenterOfResistance(cor);
      hp->setResistanceTensor(Xi);
      props.insert(map<string, HydroProp*>::value_type(name, hp));
    }
#elif defined(RAPID_JSON)
    // Parse entire file into memory once, then reuse d_ for subsequent
    // hydroProps.

    if (ifs.peek() != EOF) {
      rapidjson::IStreamWrapper isw(ifs);
      d_.ParseStream(isw);
      if (d_.HasParseError()) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "HydroIO: JSON parse error in file %s\n"
                 "\tError: %zu : %s\n",
                 f.c_str(), d_.GetErrorOffset(),
                 rapidjson::GetParseError_En(d_.GetParseError()));
        painCave.isFatal = 1;
        simError();
      }
      if (!d_.IsObject()) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "HydroIO: OpenMD-Hydro should be a single object.\n");
        painCave.isFatal = 1;
        simError();
      }
      // OpenMD-Hydro has a single object, but check that it's really
      // OpenMD-Hydro
      if (!d_.HasMember("OpenMD-Hydro")) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "HydroIO: File %s does not have a OpenMD-Hydro object.\n",
                 f.c_str());
        painCave.isFatal = 1;
        simError();
      }
    }
    const Value& entries = d_["OpenMD-Hydro"];
    for (auto& entry : entries.GetArray()) {
      HydroProp* hp = new HydroProp();
      std::string name;
      Vector3d cor;
      Mat6x6d Xi;

      name = entry["name"].GetString();

      for (unsigned int i = 0; i < 3; i++) {
        cor[i] = entry["centerOfResistance"][i].GetDouble();
      }

      for (unsigned int i = 0; i < 6; i++) {
        for (unsigned int j = 0; j < 6; j++) {
          Xi(i, j) = entry["resistanceTensor"][i][j].GetDouble();
        }
      }

      hp->setName(name);
      hp->setCenterOfResistance(cor);
      hp->setResistanceTensor(Xi);
      props.insert(map<string, HydroProp*>::value_type(name, hp));
    }
#endif
    return props;
  }